

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O2

ON_SubDVertex * __thiscall
ON_SubDEdgePtr::RelativeVertex(ON_SubDEdgePtr *this,int relative_vertex_index)

{
  ulong uVar1;
  ulong uVar2;
  
  if ((uint)relative_vertex_index < 2) {
    uVar1 = this->m_ptr & 0xfffffffffffffff8;
    if (uVar1 != 0) {
      uVar2 = (ulong)(1 - relative_vertex_index);
      if ((this->m_ptr & 1) == 0) {
        uVar2 = (ulong)(uint)relative_vertex_index;
      }
      return *(ON_SubDVertex **)(uVar1 + 0x80 + uVar2 * 8);
    }
  }
  return (ON_SubDVertex *)0x0;
}

Assistant:

const class ON_SubDVertex* ON_SubDEdgePtr::RelativeVertex(
  int relative_vertex_index
  ) const
{
  for (;;)
  {
    if (relative_vertex_index < 0 || relative_vertex_index>1)
      break;
    const ON_SubDEdge* edge = ON_SUBD_EDGE_POINTER(m_ptr);
    if (nullptr == edge)
      break;
    if (0 != ON_SUBD_EDGE_DIRECTION(m_ptr))
      relative_vertex_index = 1 - relative_vertex_index;
    return edge->m_vertex[relative_vertex_index];
  }
  return nullptr;
}